

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

Integer pnga_sprs_array_get_column(Integer s_a,Integer icol)

{
  long lVar1;
  int iVar2;
  Integer IVar3;
  long lVar4;
  size_t sVar5;
  _sparse_array *p_Var6;
  Integer IVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  char cplus [2];
  Integer ihi;
  Integer ilo;
  long local_a8;
  Integer local_a0;
  Integer local_98;
  Integer *local_90;
  void *local_88;
  Integer local_80;
  void *vptr;
  void *ptr;
  long local_68;
  long local_60;
  Integer local_58;
  Integer nprocs;
  Integer local_48;
  Integer idim;
  Integer ld;
  
  lVar1 = s_a + 1000;
  IVar3 = SPA[lVar1].type;
  idim = SPA[lVar1].idim;
  local_58 = s_a;
  IVar7 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  nprocs = IVar7;
  local_a0 = pnga_pgroup_nodeid(SPA[lVar1].grp);
  cplus[0] = '+';
  cplus[1] = '\0';
  lVar11 = (long)_ga_sync_begin;
  local_a8 = (long)_ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (lVar11 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  p_Var6 = SPA;
  lVar4 = SPA[lVar1].ilo;
  local_98 = SPA[lVar1].ihi;
  pvVar8 = malloc(IVar7 * 8);
  local_90 = (Integer *)malloc(IVar7 * 8);
  lVar10 = 0;
  lVar9 = 0;
  if (0 < IVar7) {
    lVar9 = IVar7;
  }
  for (; lVar9 != lVar10; lVar10 = lVar10 + 1) {
    *(undefined8 *)((long)pvVar8 + lVar10 * 8) = 0;
  }
  local_68 = local_98 + 1;
  *(long *)((long)pvVar8 + local_a0 * 8) = local_68 - lVar4;
  local_88 = pvVar8;
  pnga_pgroup_gop(p_Var6[lVar1].grp,0x3ea,pvVar8,IVar7,cplus);
  *local_90 = 1;
  lVar9 = 1;
  for (lVar10 = lVar9; lVar10 < IVar7; lVar10 = lVar10 + 1) {
    lVar9 = lVar9 + *(long *)((long)local_88 + lVar10 * 8 + -8);
    local_90[lVar10] = lVar9;
  }
  pnga_mask_sync(lVar11,local_a8);
  IVar7 = pnga_create_handle();
  pnga_set_data(IVar7,1,&idim,IVar3);
  pnga_set_pgroup(IVar7,SPA[lVar1].grp);
  pnga_set_irreg_distr(IVar7,local_90,&nprocs);
  pnga_mask_sync(lVar11,local_a8);
  pnga_allocate(IVar7);
  pnga_mask_sync(lVar11,local_a8);
  pnga_zero(IVar7);
  local_48 = IVar7;
  if (local_98 < lVar4) {
    ptr = (void *)0x0;
  }
  else {
    ilo = lVar4 + 1;
    ihi = local_68;
    pnga_access_ptr(IVar7,&ilo,&ihi,&ptr,&ld);
  }
  lVar11 = (nprocs * icol) / SPA[lVar1].jdim;
  local_60 = lVar11;
  for (lVar9 = 0; IVar3 = local_48, lVar9 < SPA[lVar1].nblocks; lVar9 = lVar9 + 1) {
    if (SPA[lVar1].blkidx[lVar9] == lVar11) {
      local_a0 = lVar9;
      if (SPA[lVar1].idx_size == 4) {
        pnga_sprs_array_access_col_block(local_58,lVar11,&ilo,&ihi,&vptr);
        pvVar8 = vptr;
        IVar3 = ihi;
        local_80 = ilo;
        for (lVar10 = lVar4; lVar11 = local_60, lVar9 = local_a0, lVar10 <= local_98;
            lVar10 = lVar10 + 1) {
          lVar11 = lVar10 - lVar4;
          iVar2 = *(int *)(local_80 + 4 + lVar11 * 4);
          for (lVar9 = (long)*(int *)(local_80 + lVar11 * 4); lVar9 < iVar2; lVar9 = lVar9 + 1) {
            if (*(int *)(IVar3 + lVar9 * 4) == icol) {
              sVar5 = SPA[lVar1].size;
              memcpy((void *)(sVar5 * lVar11 + (long)ptr),(void *)(sVar5 * lVar9 + (long)pvVar8),
                     sVar5);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(local_58,lVar11,&ilo,&ihi,&vptr);
        pvVar8 = vptr;
        IVar3 = ihi;
        local_80 = ilo;
        for (lVar10 = lVar4; lVar11 = local_60, lVar10 <= local_98; lVar10 = lVar10 + 1) {
          lVar12 = lVar10 - lVar4;
          lVar9 = *(long *)(local_80 + 8 + lVar12 * 8);
          for (lVar11 = *(long *)(local_80 + lVar12 * 8); lVar11 < lVar9; lVar11 = lVar11 + 1) {
            if (*(long *)(IVar3 + lVar11 * 8) == icol) {
              sVar5 = SPA[lVar1].size;
              memcpy((void *)(sVar5 * lVar12 + (long)ptr),(void *)(sVar5 * lVar11 + (long)pvVar8),
                     sVar5);
            }
          }
          lVar9 = local_a0;
        }
      }
    }
  }
  ilo = lVar4 + 1;
  ihi = local_68;
  pnga_release(local_48,&ilo,&ihi);
  free(local_90);
  free(local_88);
  if ((int)local_a8 != 0) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  return IVar3;
}

Assistant:

Integer pnga_sprs_array_get_column(Integer s_a, Integer icol)
{
  Integer g_v;
  Integer handle = s_a + GA_OFFSET;
  int local_sync_begin,local_sync_end;
  Integer type = SPA[handle].type;
  Integer one = 1;
  Integer idim = SPA[handle].idim;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer *size, *map;
  Integer i, j, n, hi, lo, ld;
  Integer iblock;
  void *ptr;
  char cplus[2];
  cplus[0] = '+';
  cplus[1] = '\0';

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* Create map array containing row offsets */
  hi = SPA[handle].ihi;
  lo = SPA[handle].ilo;
  size = (Integer*)malloc(nprocs*sizeof(Integer));
  map = (Integer*)malloc(nprocs*sizeof(Integer));
  for (i=0; i<nprocs; i++) size[i] = 0;
  size[me] = hi - lo + 1;
  if (sizeof(Integer) == sizeof(int)) {
    pnga_pgroup_gop(SPA[handle].grp,C_INT,size,nprocs,cplus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp,C_LONG,size,nprocs,cplus);
  }
  map[0] = 1;
  for (i=1; i<nprocs; i++) map[i] = map[i-1]+size[i-1];

  /* create column vector array and set it to zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  g_v = pnga_create_handle();
  pnga_set_data(g_v,one,&idim,type);
  pnga_set_pgroup(g_v,SPA[handle].grp);
  pnga_set_irreg_distr(g_v,map,&nprocs);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_allocate(g_v);
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  if (hi >= lo) {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_access_ptr(g_v,&ilo,&ihi,&ptr,&ld);
  } else {
    ptr = NULL;
  }
  /* Find column block that contains value icol. Scan through all non-zero
   * in this block and if j-index corresponds to icol, then set corresponding
   * value in g_v
   */
  iblock = (icol*nprocs)/SPA[handle].jdim;
  for (n=0; n<SPA[handle].nblocks; n++) {
    if (SPA[handle].blkidx[n] == iblock) {
      if (SPA[handle].idx_size == sizeof(int)) {
        int *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      } else {
        int64_t *iptr, *jptr;
        void *vptr;
        pnga_sprs_array_access_col_block(s_a, iblock, &iptr, &jptr, &vptr);
        for (i=lo; i<=hi; i++) {
          Integer ilo, ihi;
          Integer idx = i-lo;
          ilo = iptr[idx];
          ihi = iptr[idx+1];
          for (j=ilo; j<ihi; j++) {
            if (jptr[j] == icol) {
              char *vt = (char*)vptr+j*SPA[handle].size;
              char *pt = (char*)ptr+idx*SPA[handle].size;
              memcpy(pt, vt, SPA[handle].size);
            }
          }
        }
      }
    }
  }
  {
    Integer ilo = lo+1;
    Integer ihi = hi+1;
    pnga_release(g_v,&ilo,&ihi);
  }
  free(map);
  free(size);
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_v;
}